

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::ConductorBxDF::f(ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  Float FVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined8 uVar21;
  SampledSpectrum SVar22;
  Tuple3<pbrt::Vector3,_float> local_90;
  float local_80;
  Float local_7c;
  Tuple3<pbrt::Vector3,_float> local_78;
  Tuple3<pbrt::Vector3,_float> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  auVar20._4_60_ = wi._12_60_;
  auVar20._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._8_56_ = wi._8_56_;
  auVar19._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._4_60_ = wo._12_60_;
  auVar16._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._8_56_ = wo._8_56_;
  auVar12._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_68._0_8_ = vmovlps_avx(auVar12._0_16_);
  local_78._0_8_ = vmovlps_avx(auVar19._0_16_);
  uVar9 = 0;
  if (0.0 < auVar16._0_4_ * auVar20._0_4_) {
    auVar6 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                        ZEXT416((uint)(this->mfDistrib).alpha_x));
    uVar21 = 0;
    if (auVar6._0_4_ < 0.001) goto LAB_003d567f;
    auVar6._0_4_ = local_78.x + local_68.x;
    auVar6._4_4_ = local_78.y + local_68.y;
    auVar6._8_8_ = 0;
    local_90.z = auVar16._0_4_ + auVar20._0_4_;
    uVar1 = vmovlps_avx(auVar6);
    uVar9 = 0;
    if (((auVar16._0_4_ != 0.0) || (NAN(auVar16._0_4_))) &&
       ((auVar20._0_4_ != 0.0 || (NAN(auVar20._0_4_))))) {
      local_90.x = (float)uVar1;
      local_90.y = (float)(uVar1 >> 0x20);
      if (((local_90.z == 0.0) && (local_90.x == 0.0)) && (!NAN(local_90.x))) {
        uVar21 = 0;
        if ((local_90.y == 0.0) && (!NAN(local_90.y))) goto LAB_003d567f;
      }
      auVar10._8_4_ = 0x7fffffff;
      auVar10._0_8_ = 0x7fffffff7fffffff;
      auVar10._12_4_ = 0x7fffffff;
      local_28 = vandps_avx(auVar16._0_16_,auVar10);
      local_38 = vandps_avx(auVar20._0_16_,auVar10);
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)local_90.x),ZEXT416((uint)local_90.x),
                               ZEXT416((uint)(local_90.y * local_90.y)));
      auVar6 = vfmadd213ss_fma(ZEXT416((uint)local_90.z),ZEXT416((uint)local_90.z),auVar6);
      local_78.z = auVar20._0_4_;
      local_68.z = auVar16._0_4_;
      if (auVar6._0_4_ < 0.0) {
        local_90._0_8_ = uVar1;
        fVar7 = sqrtf(auVar6._0_4_);
      }
      else {
        auVar6 = vsqrtss_avx(auVar6,auVar6);
        fVar7 = auVar6._0_4_;
        local_90._0_8_ = uVar1;
      }
      auVar13._8_8_ = 0;
      auVar13._0_4_ = local_90.x;
      auVar13._4_4_ = local_90.y;
      auVar17._4_4_ = fVar7;
      auVar17._0_4_ = fVar7;
      auVar17._8_4_ = fVar7;
      auVar17._12_4_ = fVar7;
      auVar6 = vdivps_avx(auVar13,auVar17);
      local_90.z = local_90.z / fVar7;
      local_90._0_8_ = vmovlps_avx(auVar6);
      auVar10 = vmovshdup_avx(auVar6);
      auVar18._0_12_ = ZEXT812(0);
      auVar18._12_4_ = 0;
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * 0.0)),auVar6,auVar18);
      fVar7 = local_90.z + auVar10._0_4_;
      auVar14 = auVar6;
      if (fVar7 < 0.0) {
        auVar14._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
        auVar14._8_4_ = auVar6._8_4_ ^ 0x80000000;
        auVar14._12_4_ = auVar6._12_4_ ^ 0x80000000;
      }
      uVar21 = auVar14._8_8_;
      uVar9 = vcmpss_avx512f(ZEXT416((uint)fVar7),auVar18,1);
      bVar2 = (bool)((byte)uVar9 & 1);
      auVar6 = vmovshdup_avx(auVar14);
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * local_78.y)),auVar14,
                               ZEXT416((uint)local_78.x));
      auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)bVar2 * (int)-local_90.z +
                                              (uint)!bVar2 * (int)local_90.z),
                               ZEXT416((uint)local_78.z));
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar6 = vandps_avx512vl(auVar6,auVar3);
      uVar9 = auVar6._8_8_;
      SVar22 = FrConductor(auVar6._0_4_,&this->eta,&this->k);
      local_58 = SVar22.values.values._8_8_;
      local_48 = SVar22.values.values._0_8_;
      uStack_50 = uVar21;
      uStack_40 = uVar9;
      local_7c = TrowbridgeReitzDistribution::D(&this->mfDistrib,(Vector3f *)&local_90);
      local_80 = TrowbridgeReitzDistribution::Lambda(&this->mfDistrib,(Vector3f *)&local_68);
      FVar8 = TrowbridgeReitzDistribution::Lambda(&this->mfDistrib,(Vector3f *)&local_78);
      auVar5._8_8_ = uStack_40;
      auVar5._0_8_ = local_48;
      auVar4._8_8_ = uStack_50;
      auVar4._0_8_ = local_58;
      auVar6 = vunpcklpd_avx(auVar5,auVar4);
      fVar7 = (1.0 / (local_80 + 1.0 + FVar8)) * local_7c;
      auVar11._0_4_ = fVar7 * auVar6._0_4_;
      auVar11._4_4_ = fVar7 * auVar6._4_4_;
      auVar11._8_4_ = fVar7 * auVar6._8_4_;
      auVar11._12_4_ = fVar7 * auVar6._12_4_;
      fVar7 = (float)local_38._0_4_ * 4.0 * (float)local_28._0_4_;
      auVar15._4_4_ = fVar7;
      auVar15._0_4_ = fVar7;
      auVar15._8_4_ = fVar7;
      auVar15._12_4_ = fVar7;
      auVar6 = vdivps_avx(auVar11,auVar15);
      uVar9 = auVar6._0_8_;
      auVar6 = vshufpd_avx(auVar6,auVar6,1);
      uVar21 = auVar6._0_8_;
      goto LAB_003d567f;
    }
  }
  uVar9 = 0;
  uVar21 = 0;
LAB_003d567f:
  SVar22.values.values[2] = (float)(int)uVar21;
  SVar22.values.values[3] = (float)(int)((ulong)uVar21 >> 0x20);
  SVar22.values.values[0] = (float)(int)uVar9;
  SVar22.values.values[1] = (float)(int)((ulong)uVar9 >> 0x20);
  return (SampledSpectrum)SVar22.values.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        if (!SameHemisphere(wo, wi))
            return {};
        if (mfDistrib.EffectivelySpecular())
            return {};
        Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
        Vector3f wh = wi + wo;
        // Handle degenerate cases for microfacet reflection
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return {};
        if (wh.x == 0 && wh.y == 0 && wh.z == 0)
            return {};

        wh = Normalize(wh);
        Float frCosTheta_i = AbsDot(wi, FaceForward(wh, Vector3f(0, 0, 1)));
        SampledSpectrum F = FrConductor(frCosTheta_i, eta, k);
        return mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F / (4 * cosTheta_i * cosTheta_o);
    }